

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

void __thiscall Js::ScriptContext::LogBailout(ScriptContext *this,FunctionBody *body,uint kind)

{
  bool bVar1;
  uint local_24 [2];
  uint val;
  FunctionBody *pFStack_18;
  uint kind_local;
  FunctionBody *body_local;
  ScriptContext *this_local;
  
  val = kind;
  pFStack_18 = body;
  body_local = (FunctionBody *)this;
  bVar1 = JsUtil::
          BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::ContainsKey(this->bailoutReasonCounts,&val);
  if (bVar1) {
    local_24[0] = JsUtil::
                  BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  ::Item(this->bailoutReasonCounts,&val);
    local_24[0] = local_24[0] + 1;
    JsUtil::
    BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Item(this->bailoutReasonCounts,&val,local_24);
  }
  else {
    local_24[1] = 1;
    JsUtil::
    BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Item(this->bailoutReasonCounts,&val,local_24 + 1);
  }
  if ((DAT_01ec73ca & 1) != 0) {
    LogDataForFunctionBody(this,pFStack_18,val,false);
  }
  return;
}

Assistant:

void ScriptContext::LogBailout(Js::FunctionBody *body, uint kind)
    {
        if (!bailoutReasonCounts->ContainsKey(kind))
        {
            bailoutReasonCounts->Item(kind, 1);
        }
        else
        {
            uint val = bailoutReasonCounts->Item(kind);
            ++val;
            bailoutReasonCounts->Item(kind, val);
        }

        if (CONFIG_FLAG(Verbose))
        {
            LogDataForFunctionBody(body, kind, false);
        }
    }